

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O0

bool __thiscall
google::protobuf::util::MessageDifferencer::MultipleFieldsMapKeyComparator::IsMatchInternal
          (MultipleFieldsMapKeyComparator *this,Message *message1,Message *message2,int unpacked_any
          ,vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
           *parent_fields,
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          *key_field_path,int path_index)

{
  bool bVar1;
  const_reference ppFVar2;
  size_type sVar3;
  Reflection *this_00;
  Reflection *this_01;
  Message *message1_00;
  Message *message2_00;
  undefined1 local_e8 [8];
  SpecificField specific_field;
  bool has_field2;
  bool has_field1;
  Reflection *reflection2;
  Reflection *reflection1;
  undefined1 local_60 [8];
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  current_parent_fields;
  FieldDescriptor *field;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  *key_field_path_local;
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  *parent_fields_local;
  int unpacked_any_local;
  Message *message2_local;
  Message *message1_local;
  MultipleFieldsMapKeyComparator *this_local;
  
  ppFVar2 = std::
            vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ::operator[](key_field_path,(long)path_index);
  current_parent_fields.
  super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)*ppFVar2;
  std::
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  ::vector((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
            *)local_60,parent_fields);
  sVar3 = std::
          vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
          ::size(key_field_path);
  if ((long)path_index == sVar3 - 1) {
    bVar1 = FieldDescriptor::is_map
                      ((FieldDescriptor *)
                       current_parent_fields.
                       super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (bVar1) {
      this_local._7_1_ =
           CompareMapField(this->message_differencer_,message1,message2,unpacked_any,
                           (FieldDescriptor *)
                           current_parent_fields.
                           super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                            *)local_60);
    }
    else {
      bVar1 = FieldDescriptor::is_repeated
                        ((FieldDescriptor *)
                         current_parent_fields.
                         super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage);
      if (bVar1) {
        this_local._7_1_ =
             CompareRepeatedField
                       (this->message_differencer_,message1,message2,unpacked_any,
                        (FieldDescriptor *)
                        current_parent_fields.
                        super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,
                        (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                         *)local_60);
      }
      else {
        this_local._7_1_ =
             CompareFieldValueUsingParentFields
                       (this->message_differencer_,message1,message2,unpacked_any,
                        (FieldDescriptor *)
                        current_parent_fields.
                        super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage,-1,-1,
                        (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                         *)local_60);
      }
    }
  }
  else {
    this_00 = Message::GetReflection(message1);
    this_01 = Message::GetReflection(message2);
    specific_field._95_1_ =
         Reflection::HasField
                   (this_00,message1,
                    (FieldDescriptor *)
                    current_parent_fields.
                    super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    specific_field._94_1_ =
         Reflection::HasField
                   (this_01,message2,
                    (FieldDescriptor *)
                    current_parent_fields.
                    super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
    if (((specific_field._95_1_ & 1) != 0) || ((bool)specific_field._94_1_)) {
      if ((specific_field._95_1_ & 1) == specific_field._94_1_) {
        SpecificField::SpecificField((SpecificField *)local_e8);
        specific_field._16_8_ =
             current_parent_fields.
             super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
             ._M_impl.super__Vector_impl_data._M_end_of_storage;
        local_e8 = (undefined1  [8])message1;
        specific_field.message1 = message2;
        specific_field.message2._0_4_ = unpacked_any;
        std::
        vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
        ::push_back((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                     *)local_60,(SpecificField *)local_e8);
        message1_00 = Reflection::GetMessage
                                (this_00,message1,
                                 (FieldDescriptor *)
                                 current_parent_fields.
                                 super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (MessageFactory *)0x0);
        message2_00 = Reflection::GetMessage
                                (this_01,message2,
                                 (FieldDescriptor *)
                                 current_parent_fields.
                                 super__Vector_base<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                                 ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                 (MessageFactory *)0x0);
        this_local._7_1_ =
             IsMatchInternal(this,message1_00,message2_00,0,
                             (vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
                              *)local_60,key_field_path,path_index + 1);
      }
      else {
        this_local._7_1_ = false;
      }
    }
    else {
      this_local._7_1_ = true;
    }
  }
  std::
  vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
  ::~vector((vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
             *)local_60);
  return this_local._7_1_;
}

Assistant:

bool IsMatchInternal(
      const Message& message1, const Message& message2, int unpacked_any,
      const std::vector<SpecificField>& parent_fields,
      const std::vector<const FieldDescriptor*>& key_field_path,
      int path_index) const {
    const FieldDescriptor* field = key_field_path[path_index];
    std::vector<SpecificField> current_parent_fields(parent_fields);
    if (path_index == static_cast<int64_t>(key_field_path.size() - 1)) {
      if (field->is_map()) {
        return message_differencer_->CompareMapField(
            message1, message2, unpacked_any, field, &current_parent_fields);
      } else if (field->is_repeated()) {
        return message_differencer_->CompareRepeatedField(
            message1, message2, unpacked_any, field, &current_parent_fields);
      } else {
        return message_differencer_->CompareFieldValueUsingParentFields(
            message1, message2, unpacked_any, field, -1, -1,
            &current_parent_fields);
      }
    } else {
      const Reflection* reflection1 = message1.GetReflection();
      const Reflection* reflection2 = message2.GetReflection();
      bool has_field1 = reflection1->HasField(message1, field);
      bool has_field2 = reflection2->HasField(message2, field);
      if (!has_field1 && !has_field2) {
        return true;
      }
      if (has_field1 != has_field2) {
        return false;
      }
      SpecificField specific_field;
      specific_field.message1 = &message1;
      specific_field.message2 = &message2;
      specific_field.unpacked_any = unpacked_any;
      specific_field.field = field;
      current_parent_fields.push_back(specific_field);
      return IsMatchInternal(reflection1->GetMessage(message1, field),
                             reflection2->GetMessage(message2, field),
                             false /*key is never Any*/, current_parent_fields,
                             key_field_path, path_index + 1);
    }
  }